

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall
cmMakefile::ExpandArguments
          (cmMakefile *this,vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *inArgs,
          vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *outArgs,
          char *filename)

{
  pointer pcVar1;
  pointer pbVar2;
  bool bVar3;
  pointer __args;
  string *stringArg;
  pointer __args_00;
  bool local_99;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stringArgs;
  string value;
  string efp;
  
  GetExecutionFilePath_abi_cxx11_(&efp,this);
  if (filename == (char *)0x0) {
    filename = (char *)efp._M_dataplus;
  }
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  value.field_2._M_local_buf[0] = '\0';
  std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::reserve
            (outArgs,((long)(inArgs->
                            super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(inArgs->
                           super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                           )._M_impl.super__Vector_impl_data._M_start) / 0x30);
  pcVar1 = (inArgs->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (__args = (inArgs->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                )._M_impl.super__Vector_impl_data._M_start; __args != pcVar1; __args = __args + 1) {
    if (__args->Delim == Bracket) {
      stringArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT71(stringArgs.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
      std::vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>::
      emplace_back<std::__cxx11::string_const&,bool>
                ((vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>> *)
                 outArgs,&__args->Value,(bool *)&stringArgs);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&value);
      ExpandVariablesInString(this,&value,false,false,false,filename,__args->Line,false,false);
      if (__args->Delim == Quoted) {
        stringArgs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(stringArgs.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
        std::vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>::
        emplace_back<std::__cxx11::string&,bool>
                  ((vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>> *)
                   outArgs,&value,(bool *)&stringArgs);
      }
      else {
        stringArgs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        stringArgs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        stringArgs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cmSystemTools::ExpandListArgument(&value,&stringArgs,false);
        pbVar2 = stringArgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (__args_00 = stringArgs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; __args_00 != pbVar2;
            __args_00 = __args_00 + 1) {
          local_99 = false;
          std::vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>::
          emplace_back<std::__cxx11::string_const&,bool>
                    ((vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>> *)
                     outArgs,__args_00,&local_99);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&stringArgs);
      }
    }
  }
  bVar3 = cmSystemTools::GetFatalErrorOccured();
  std::__cxx11::string::~string((string *)&value);
  std::__cxx11::string::~string((string *)&efp);
  return !bVar3;
}

Assistant:

bool cmMakefile::ExpandArguments(
  std::vector<cmListFileArgument> const& inArgs,
  std::vector<cmExpandedCommandArgument>& outArgs, const char* filename) const
{
  std::string efp = this->GetExecutionFilePath();
  if (!filename) {
    filename = efp.c_str();
  }
  std::string value;
  outArgs.reserve(inArgs.size());
  for (cmListFileArgument const& i : inArgs) {
    // No expansion in a bracket argument.
    if (i.Delim == cmListFileArgument::Bracket) {
      outArgs.emplace_back(i.Value, true);
      continue;
    }
    // Expand the variables in the argument.
    value = i.Value;
    this->ExpandVariablesInString(value, false, false, false, filename, i.Line,
                                  false, false);

    // If the argument is quoted, it should be one argument.
    // Otherwise, it may be a list of arguments.
    if (i.Delim == cmListFileArgument::Quoted) {
      outArgs.emplace_back(value, true);
    } else {
      std::vector<std::string> stringArgs;
      cmSystemTools::ExpandListArgument(value, stringArgs);
      for (std::string const& stringArg : stringArgs) {
        outArgs.emplace_back(stringArg, false);
      }
    }
  }
  return !cmSystemTools::GetFatalErrorOccured();
}